

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::X<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *xi
          ,TPZVec<Fad<double>_> *result)

{
  double dVar1;
  TPZGeoMesh *gmesh;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  int x;
  long row;
  Fad<double> local_1378;
  TPZManVector<bool,_20> isRegularMapping;
  TPZFNMatrix<27,_Fad<double>_> projectedPointOverSide;
  TPZManVector<Fad<double>,_3> notUsedHereVec;
  TPZFNMatrix<9,_Fad<double>_> phi;
  TPZFNMatrix<9,_Fad<double>_> notUsedHereMat;
  TPZFNMatrix<27,_Fad<double>_> linearSideMappings;
  TPZFNMatrix<27,_Fad<double>_> nonLinearSideMappings;
  TPZManVector<Fad<double>,_20> blendFactor;
  
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  gmesh = this->fGeoEl->fMesh;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector
            (&notUsedHereVec,3,(Fad<double> *)&projectedPointOverSide);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (&notUsedHereMat,1,1,(Fad<double> *)&projectedPointOverSide);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  (*result->_vptr_TPZVec[3])(result,3);
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fRow =
       projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
       super_TPZBaseMatrix.fRow & 0xffffffff00000000;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fCol = 0;
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix.fDefPositive = '\0';
  projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
  super_TPZBaseMatrix._26_6_ = 0;
  TPZVec<Fad<double>_>::Fill(result,(Fad<double> *)&projectedPointOverSide,0,-1);
  Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
  if ((this->super_TPZGeoPoint).super_TPZNodeRep<1,_pztopology::TPZPoint>.fNodeIndexes[0] == -1) {
    TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&phi,1,1);
    pztopology::TPZPoint::TShape<Fad<double>>
              (xi,&phi.super_TPZFMatrix<Fad<double>_>,&notUsedHereMat.super_TPZFMatrix<Fad<double>_>
              );
    lVar4 = 0;
    for (row = 0; row != 3; row = row + 1) {
      pdVar3 = TPZFMatrix<double>::operator()(coord,row,0);
      dVar1 = *pdVar3;
      projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix._24_8_ =
           TPZFMatrix<Fad<double>_>::operator()(&phi.super_TPZFMatrix<Fad<double>_>,0,0);
      projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fCol = 0;
      projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
      super_TPZBaseMatrix.fRow = (int64_t)dVar1;
      Fad<double>::operator+=
                ((Fad<double> *)((long)&result->fStore->val_ + lVar4),
                 (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&projectedPointOverSide);
      lVar4 = lVar4 + 0x20;
    }
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable & 0xffffffffffffff00;
    TPZManVector<bool,_20>::TPZManVector(&isRegularMapping,0,(bool *)&projectedPointOverSide);
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow =
         projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow & 0xffffffff00000000;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    projectedPointOverSide.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZManVector<Fad<double>,_20>::TPZManVector
              (&blendFactor,0,(Fad<double> *)&projectedPointOverSide);
    Fad<double>::~Fad((Fad<double> *)&projectedPointOverSide);
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    linearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&projectedPointOverSide,0,0,(Fad<double> *)&linearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&linearSideMappings);
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fRow._0_4_ = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fCol = 0;
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDecomposed = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix.fDefPositive = '\0';
    nonLinearSideMappings.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
    super_TPZBaseMatrix._26_6_ = 0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix
              (&linearSideMappings,0,3,(Fad<double> *)&nonLinearSideMappings);
    Fad<double>::~Fad((Fad<double> *)&nonLinearSideMappings);
    local_1378.val_ = 0.0;
    local_1378.dx_.num_elts = 0;
    local_1378.dx_.ptr_to_data = (double *)0x0;
    local_1378.defaultVal = 0.0;
    TPZFNMatrix<27,_Fad<double>_>::TPZFNMatrix(&nonLinearSideMappings,0,3,&local_1378);
    Fad<double>::~Fad(&local_1378);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_Fad<double>_>::~TPZFNMatrix(&projectedPointOverSide);
    TPZManVector<Fad<double>,_20>::~TPZManVector(&blendFactor);
    TPZManVector<bool,_20>::~TPZManVector(&isRegularMapping);
    TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<Fad<double>,_3>::TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&projectedPointOverSide,0);
    bVar2 = MapToNeighSide<Fad<double>>
                      (this,0,0,xi,(TPZVec<Fad<double>_> *)&projectedPointOverSide,
                       &notUsedHereMat.super_TPZFMatrix<Fad<double>_>);
    if (!bVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    Neighbour((TPZGeoElSide *)&linearSideMappings,this,0,gmesh);
    TPZGeoElSide::X((TPZGeoElSide *)&linearSideMappings,
                    (TPZVec<Fad<double>_> *)&projectedPointOverSide,result);
    TPZManVector<Fad<double>,_3>::~TPZManVector
              ((TPZManVector<Fad<double>,_3> *)&projectedPointOverSide);
  }
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&notUsedHereMat);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&notUsedHereVec);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}